

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O3

string * fs_root_abi_cxx11_(string_view path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> local_71;
  path local_70;
  path local_48;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_48,&local_20,auto_format);
  std::filesystem::__cxx11::path::root_path();
  std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
            (in_RDI,&local_70,&local_71);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::path::~path(&local_48);
  return in_RDI;
}

Assistant:

std::string fs_root(std::string_view path)
{
  // root_path = root_name / root_directory

#ifdef HAVE_CXX_FILESYSTEM
  return std::filesystem::path(path).root_path().generic_string();
#else
  if (std::string r = fs_root_name(path);
       r.empty())
    return fs_slash_first(path) ? "/" : "";
  else
    return (fs_is_windows() && r == path) ? r : r + "/";
#endif
}